

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-recall.c
# Opt level: O3

void recall_display(menu_conflict *menu,int oid,_Bool cursor,int row,int col,int width)

{
  ushort uVar1;
  uint uVar2;
  locality locality;
  void *pvVar3;
  char *pcVar4;
  uint8_t attr;
  char place [30];
  char acStack_48 [40];
  
  pvVar3 = menu_priv(menu);
  uVar1 = *(ushort *)((long)pvVar3 + (long)oid * 2);
  if ((int)(uint)uVar1 < num_recall_points) {
    uVar2 = world->levels[player->recall[uVar1]].depth;
    locality = world->levels[player->recall[uVar1]].locality;
    if (uVar2 == 0) {
      if (locality == LOC_ARENA) {
        pcVar4 = "No location set     ";
      }
      else {
        pcVar4 = locality_name(locality);
        pcVar4 = format("%s Town   ",pcVar4);
      }
    }
    else {
      pcVar4 = locality_name(locality);
      pcVar4 = format("%s %d   ",pcVar4,(ulong)uVar2);
    }
  }
  else {
    pcVar4 = "Don\'t replace     ";
  }
  my_strcpy(acStack_48,pcVar4,0x1e);
  pcVar4 = format("%s",acStack_48);
  attr = '\x01';
  if (cursor) {
    attr = '\x0e';
  }
  c_put_str(attr,pcVar4,row,col);
  return;
}

Assistant:

static void recall_display(struct menu *menu, int oid, bool cursor, int row,
					int col, int width)
{
	const uint16_t *choice = menu_priv(menu);
	int idx = choice[oid];
	char place[30];

	uint8_t attr = (cursor ? COLOUR_L_BLUE : COLOUR_WHITE);

	if (idx < num_recall_points) {
		int locality = world->levels[player->recall[idx]].locality;
		int level = world->levels[player->recall[idx]].depth;

		/* Get the recall point description */
		if (level) {
			my_strcpy(place, format("%s %d   ", locality_name(locality), level),
					  sizeof(place));
		} else if (locality != LOC_ARENA) {
			my_strcpy(place, format("%s Town   ", locality_name(locality)),
					  sizeof(place));
		} else {
		    my_strcpy(place, "No location set     ", sizeof(place));
		}
	} else {
		my_strcpy(place, "Don't replace     ", sizeof(place));
	}

	/* Print it */
	c_put_str(attr, format("%s", place), row, col);
}